

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flat_hash_map.hpp
# Opt level: O2

sherwood_v3_entry<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* ska::detailv3::empty_default_table<std::__cxx11::string>(void)

{
  int iVar1;
  
  if ((empty_default_table<std::__cxx11::string>()::result_abi_cxx11_ == '\0') &&
     (iVar1 = __cxa_guard_acquire(&empty_default_table<std::__cxx11::string>()::result_abi_cxx11_),
     iVar1 != 0)) {
    empty_default_table<std::__cxx11::string>()::result_abi_cxx11_[0].distance_from_desired = -1;
    empty_default_table<std::__cxx11::string>()::result_abi_cxx11_[1].distance_from_desired = -1;
    empty_default_table<std::__cxx11::string>()::result_abi_cxx11_[2].distance_from_desired = -1;
    empty_default_table<std::__cxx11::string>()::result_abi_cxx11_[3].distance_from_desired = '\0';
    __cxa_guard_release(&empty_default_table<std::__cxx11::string>()::result_abi_cxx11_);
  }
  return empty_default_table<std::__cxx11::string>()::result_abi_cxx11_;
}

Assistant:

sherwood_v3_entry<T> * empty_default_table()
{
    static constexpr int8_t special_end_value = 0;
    static sherwood_v3_entry<T> result[min_lookups] = { {}, {}, {}, {special_end_value} };
    return result;
}